

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QGraphicsItemCache * __thiscall QGraphicsItemPrivate::extraItemCache(QGraphicsItemPrivate *this)

{
  QList<QGraphicsItemPrivate::ExtraStruct> *this_00;
  ulong uVar1;
  long lVar2;
  ExtraStruct *pEVar3;
  bool bVar4;
  int iVar5;
  QMetaType QVar6;
  pointer pEVar7;
  long lVar8;
  ExtraStruct *pEVar9;
  QMetaType mt;
  PrivateShared *pPVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  void *t;
  QMetaType local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 local_58 [48];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->extras).d.size;
  if (uVar1 != 0) {
    pEVar9 = (this->extras).d.ptr;
    if (pEVar9->type == ExtraCacheData) {
      ::QVariant::QVariant((QVariant *)local_58,&pEVar9->value);
      goto LAB_005e8097;
    }
    uVar11 = 0;
    do {
      pEVar3 = pEVar9;
      pEVar9 = pEVar3 + 1;
      if (uVar1 - 1 == uVar11) goto LAB_005e807b;
      uVar11 = uVar11 + 1;
    } while (pEVar9->type != ExtraCacheData);
    ::QVariant::QVariant((QVariant *)local_58,&pEVar3[1].value);
    if (uVar11 < uVar1) goto LAB_005e8097;
  }
LAB_005e807b:
  local_58._0_16_ = (undefined1  [16])0x0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 2;
LAB_005e8097:
  local_78.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType;
  local_80.d_ptr = (QMetaTypeInterface *)(local_58._24_8_ & 0xfffffffffffffffc);
  bVar4 = comparesEqual(&local_80,(QMetaType *)&local_78.shared);
  if (bVar4) {
    QVar6.d_ptr = (QMetaTypeInterface *)local_58._0_8_;
    if ((local_58._24_8_ & 1) != 0) {
      QVar6.d_ptr = *(QMetaTypeInterface **)(local_58._0_8_ + (long)*(int *)(local_58._0_8_ + 4));
    }
  }
  else {
    local_80.d_ptr = (QMetaTypeInterface *)0x0;
    pPVar10 = (PrivateShared *)local_58;
    QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_58._24_8_ & 1) != 0) {
      pPVar10 = (PrivateShared *)(local_58._0_8_ + (long)*(int *)(local_58._0_8_ + 4));
    }
    QMetaType::convert(QVar6,pPVar10,(QMetaType)local_78.shared,&local_80);
    QVar6.d_ptr = local_80.d_ptr;
  }
  ::QVariant::~QVariant((QVariant *)local_58);
  if (QVar6.d_ptr == (QMetaTypeInterface *)0x0) {
    QVar6.d_ptr = (QMetaTypeInterface *)operator_new(0x48);
    (QVar6.d_ptr)->revision = 0;
    (QVar6.d_ptr)->alignment = 0;
    (QVar6.d_ptr)->size = 0;
    ((Representation *)&(QVar6.d_ptr)->flags)->m_i = -1;
    ((QVar6.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i = -1;
    (((QSize *)&(QVar6.d_ptr)->metaObjectFn)->wd).m_i = -1;
    (((QSize *)&(QVar6.d_ptr)->metaObjectFn)->ht).m_i = -1;
    QPixmapCache::Key::Key((Key *)&(QVar6.d_ptr)->name);
    *(undefined1 (*) [16])&(QVar6.d_ptr)->moveCtr = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&(QVar6.d_ptr)->defaultCtr = (undefined1  [16])0x0;
    *(bool *)&(QVar6.d_ptr)->equals = false;
    local_80.d_ptr = QVar6.d_ptr;
    if (_DAT_0083ffa4 == 0) {
      QMetaType::registerHelper
                ((QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType);
    }
    ::QVariant::moveConstruct
              ((QMetaTypeInterface *)&local_78,
               &QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType);
    lVar2 = (this->extras).d.size;
    iVar5 = -1;
    if (lVar2 != 0) {
      pEVar9 = (this->extras).d.ptr;
      lVar8 = 0;
      do {
        if (pEVar9->type == ExtraCacheData) {
          iVar5 = (int)lVar8;
          break;
        }
        lVar8 = lVar8 + 1;
        pEVar9 = pEVar9 + 1;
      } while (lVar2 != lVar8);
    }
    this_00 = &this->extras;
    if (iVar5 == -1) {
      local_58._0_4_ = 2;
      ::QVariant::QVariant((QVariant *)(local_58 + 8),(QVariant *)&local_78);
      QtPrivate::QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct>::
      emplace<QGraphicsItemPrivate::ExtraStruct>
                ((QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct> *)this_00,
                 (this->extras).d.size,(ExtraStruct *)local_58);
      QList<QGraphicsItemPrivate::ExtraStruct>::end(this_00);
      ::QVariant::~QVariant((QVariant *)(local_58 + 8));
    }
    else {
      pEVar7 = QList<QGraphicsItemPrivate::ExtraStruct>::data(this_00);
      ::QVariant::operator=(&pEVar7[iVar5].value,(QVariant *)&local_78);
    }
    ::QVariant::~QVariant((QVariant *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QGraphicsItemCache *)QVar6.d_ptr;
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::extraItemCache() const
{
    QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
    if (!c) {
        QGraphicsItemPrivate *that = const_cast<QGraphicsItemPrivate *>(this);
        c = new QGraphicsItemCache;
        that->setExtra(ExtraCacheData, QVariant::fromValue<void *>(c));
    }
    return c;
}